

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter01.c
# Opt level: O0

int main(void)

{
  int iVar1;
  ZyanU64 ZVar2;
  undefined1 local_34 [8];
  ZydisDecoder decoder;
  ZyanU8 data [27];
  
  ZVar2 = ZydisGetVersion();
  if (ZVar2 == 0x4000000000000) {
    decoder.stack_width = 0x39058b48;
    decoder.decoder_mode = 0x50001300;
    ZydisDecoderInit((ZydisDecoder *)local_34,ZYDIS_MACHINE_MODE_LONG_64,ZYDIS_STACK_WIDTH_64);
    DisassembleBuffer((ZydisDecoder *)local_34,(ZyanU8 *)&decoder.stack_width,0x1b);
  }
  else {
    fputs("Invalid zydis version\n",_stderr);
  }
  iVar1._0_1_ = ZVar2 != 0x4000000000000;
  iVar1._1_1_ = '\0';
  iVar1._2_1_ = '\0';
  iVar1._3_1_ = '\0';
  return iVar1;
}

Assistant:

int main(void)
{
    if (ZydisGetVersion() != ZYDIS_VERSION)
    {
        fputs("Invalid zydis version\n", ZYAN_STDERR);
        return EXIT_FAILURE;
    }

    ZyanU8 data[] =
    {
        0x48, 0x8B, 0x05, 0x39, 0x00, 0x13, 0x00, // mov rax, qword ptr ds:[<SomeModule.SomeData>]
        0x50,                                     // push rax
        0xFF, 0x15, 0xF2, 0x10, 0x00, 0x00,       // call qword ptr ds:[<SomeModule.SomeFunction>]
        0x85, 0xC0,                               // test eax, eax
        0x0F, 0x84, 0x00, 0x00, 0x00, 0x00,       // jz 0x007FFFFFFF400016
        0xE9, 0xE5, 0x0F, 0x00, 0x00              // jmp <SomeModule.EntryPoint>
    };

    ZydisDecoder decoder;
    ZydisDecoderInit(&decoder, ZYDIS_MACHINE_MODE_LONG_64, ZYDIS_STACK_WIDTH_64);

    DisassembleBuffer(&decoder, &data[0], sizeof(data));

    return 0;
}